

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf_mem_image.cc
# Opt level: O2

bool __thiscall
absl::lts_20250127::debugging_internal::ElfMemImage::LookupSymbolByAddress
          (ElfMemImage *this,void *address,SymbolInfo *info_out)

{
  byte bVar1;
  uint32_t uVar2;
  bool bVar3;
  SymbolInfo *info;
  ElfMemImage *__range2;
  bool bVar4;
  SymbolIterator __begin2;
  SymbolIterator local_58;
  
  begin(&local_58,this);
  uVar2 = this->num_syms_;
  do {
    bVar4 = local_58.index_ != uVar2;
    bVar3 = bVar4 || (ElfMemImage *)local_58.image_ != this;
    if (!bVar4 && (ElfMemImage *)local_58.image_ == this) {
      return bVar3;
    }
    if ((local_58.info_.address <= address) &&
       (address < (void *)((long)local_58.info_.address + (local_58.info_.symbol)->st_size))) {
      if (info_out == (SymbolInfo *)0x0) {
        return bVar3;
      }
      bVar1 = (local_58.info_.symbol)->st_info;
      info_out->address = local_58.info_.address;
      info_out->symbol = local_58.info_.symbol;
      info_out->name = local_58.info_.name;
      info_out->version = local_58.info_.version;
      if ((bVar1 & 0xf0) == 0x10) {
        return bVar3;
      }
    }
    SymbolIterator::operator++(&local_58);
  } while( true );
}

Assistant:

bool ElfMemImage::LookupSymbolByAddress(const void *address,
                                        SymbolInfo *info_out) const {
  for (const SymbolInfo& info : *this) {
    const char *const symbol_start =
        reinterpret_cast<const char *>(info.address);
    const char *const symbol_end = symbol_start + info.symbol->st_size;
    if (symbol_start <= address && address < symbol_end) {
      if (info_out) {
        // Client wants to know details for that symbol (the usual case).
        if (ElfBind(info.symbol) == STB_GLOBAL) {
          // Strong symbol; just return it.
          *info_out = info;
          return true;
        } else {
          // Weak or local. Record it, but keep looking for a strong one.
          *info_out = info;
        }
      } else {
        // Client only cares if there is an overlapping symbol.
        return true;
      }
    }
  }
  return false;
}